

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall
QAbstractItemView::rowsAboutToBeRemoved
          (QAbstractItemView *this,QModelIndex *parent,int start,int end)

{
  QPersistentModelIndex *pQVar1;
  long lVar2;
  QWidget *this_00;
  QObject *pQVar3;
  int iVar4;
  QPersistentModelIndex QVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *pDVar10;
  long *plVar11;
  int iVar12;
  uint uVar13;
  QPersistentModelIndexData *pQVar14;
  QAbstractItemViewPrivate *d;
  size_t sVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  bool bVar17;
  piter it;
  QModelIndex local_c8;
  QModelIndex local_a8;
  QPersistentModelIndex local_88;
  QObject *pQStack_80;
  QAbstractItemModel *local_78;
  void *local_68;
  undefined8 local_60;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  *(undefined4 *)(lVar2 + 0x3a8) = 5;
  local_a8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  currentIndex(&local_a8,this);
  if (((((*(int *)(lVar2 + 0x338) == 1) && (local_a8.r <= end)) && (start <= local_a8.r)) &&
      ((-1 < local_a8.r && (-1 < (long)local_a8._0_8_)))) &&
     (local_a8.m.ptr != (QAbstractItemModel *)0x0)) {
    (**(code **)(*(long *)local_a8.m.ptr + 0x68))(&local_58,local_a8.m.ptr,&local_a8);
    if (((local_58.r == parent->r) && (local_58.c == parent->c)) &&
       (((QObject *)local_58.i == (QObject *)parent->i && (local_58.m.ptr == (parent->m).ptr)))) {
      iVar7 = (**(code **)(**(long **)(lVar2 + 0x2f8) + 0x78))(*(long **)(lVar2 + 0x2f8),parent);
      if ((end - start) + 1 < iVar7) {
        local_58._0_8_ = (QPersistentModelIndexData *)0xffffffffffffffff;
        local_58.i = 0;
        local_58.m.ptr = (QAbstractItemModel *)0x0;
        iVar7 = (**(code **)(**(long **)(lVar2 + 0x2f8) + 0x78))(*(long **)(lVar2 + 0x2f8),parent);
        iVar12 = end + 1;
        if (iVar12 < iVar7) {
          do {
            plVar11 = *(long **)(lVar2 + 0x2f8);
            iVar4 = local_a8.c;
            if (local_a8.m.ptr == (QAbstractItemModel *)0x0) {
              local_c8._0_8_ = (QPersistentModelIndexData *)0xffffffffffffffff;
              local_c8.i = 0;
              local_c8.m.ptr = (QAbstractItemModel *)0x0;
            }
            else {
              (**(code **)(*(long *)local_a8.m.ptr + 0x68))(&local_c8,local_a8.m.ptr,&local_a8);
            }
            (**(code **)(*plVar11 + 0x60))(&local_88,plVar11,iVar12,iVar4,&local_c8);
            local_58.m.ptr = local_78;
            local_58._0_8_ = local_88.d;
            local_58.i = (quintptr)pQStack_80;
            cVar6 = (**(code **)(*(long *)this + 0x2c0))(this,&local_58);
            if ((cVar6 == '\0') &&
               (uVar9 = (**(code **)(**(long **)(lVar2 + 0x2f8) + 0x138))
                                  (*(long **)(lVar2 + 0x2f8),&local_58), (uVar9 & 0x20) != 0))
            goto LAB_0053a122;
            iVar12 = iVar12 + 1;
          } while (iVar7 != iVar12);
        }
        uVar8 = start;
        if (0 < start) {
          do {
            while( true ) {
              plVar11 = *(long **)(lVar2 + 0x2f8);
              iVar7 = local_a8.c;
              if (local_a8.m.ptr == (QAbstractItemModel *)0x0) {
                local_c8._0_8_ = (QPersistentModelIndexData *)0xffffffffffffffff;
                local_c8.i = 0;
                local_c8.m.ptr = (QAbstractItemModel *)0x0;
              }
              else {
                (**(code **)(*(long *)local_a8.m.ptr + 0x68))(&local_c8,local_a8.m.ptr,&local_a8);
              }
              uVar13 = uVar8 - 1;
              (**(code **)(*plVar11 + 0x60))(&local_88,plVar11,uVar13,iVar7,&local_c8);
              local_58.m.ptr = local_78;
              local_58._0_8_ = local_88.d;
              local_58.i = (quintptr)pQStack_80;
              cVar6 = (**(code **)(*(long *)this + 0x2c0))(this,&local_58);
              if (cVar6 != '\0') break;
              uVar9 = (**(code **)(**(long **)(lVar2 + 0x2f8) + 0x138))
                                (*(long **)(lVar2 + 0x2f8),&local_58);
              if (((uVar9 & 0x20) != 0) || (bVar17 = uVar8 < 2, uVar8 = uVar13, bVar17))
              goto LAB_0053a122;
            }
            bVar17 = 1 < uVar8;
            uVar8 = uVar13;
          } while (bVar17);
        }
LAB_0053a122:
        setCurrentIndex(this,&local_58);
      }
      else {
        local_58.m.ptr = (parent->m).ptr;
        local_58._0_8_ = *(undefined8 *)parent;
        local_58.i = parent->i;
        pQVar1 = (QPersistentModelIndex *)(lVar2 + 0x3b8);
        cVar6 = comparesEqual(pQVar1,&local_58);
        if (cVar6 == '\0') {
          do {
            uVar9 = (**(code **)(**(long **)(lVar2 + 0x2f8) + 0x138))
                              (*(long **)(lVar2 + 0x2f8),&local_58);
            if ((uVar9 & 0x20) != 0) break;
            if (local_58.m.ptr == (QAbstractItemModel *)0x0) {
              local_88.d = (QPersistentModelIndexData *)0xffffffffffffffff;
              pQStack_80 = (QObject *)0x0;
              local_78 = (QAbstractItemModel *)0x0;
            }
            else {
              (**(code **)(*(long *)local_58.m.ptr + 0x68))(&local_88,local_58.m.ptr,&local_58);
            }
            local_58.m.ptr = local_78;
            local_58._0_8_ = local_88.d;
            local_58.i = (quintptr)pQStack_80;
            cVar6 = comparesEqual(pQVar1,&local_58);
          } while (cVar6 == '\0');
        }
        cVar6 = comparesEqual(pQVar1,&local_58);
        if (cVar6 == '\0') {
          setCurrentIndex(this,&local_58);
        }
      }
    }
  }
  pDVar10 = *(Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> **)(lVar2 + 0x340);
  if (pDVar10 == (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0) {
    pDVar10 = (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0;
    sVar15 = 0;
LAB_0053a1ba:
    if (pDVar10 == (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0 && sVar15 == 0
       ) goto LAB_0053a51e;
  }
  else {
    if (1 < (uint)(pDVar10->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar10 = QHashPrivate::Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_>::detached
                          (pDVar10);
      ((QHash<QWidget_*,_QPersistentModelIndex> *)(lVar2 + 0x340))->d = pDVar10;
    }
    if (pDVar10->spans->offsets[0] == 0xff) {
      uVar9 = 1;
      do {
        sVar15 = uVar9;
        if (pDVar10->numBuckets == sVar15) {
          pDVar10 = (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0;
          sVar15 = 0;
          break;
        }
        uVar9 = sVar15 + 1;
      } while (pDVar10->spans[sVar15 >> 7].offsets[(uint)sVar15 & 0x7f] == 0xff);
      goto LAB_0053a1ba;
    }
    sVar15 = 0;
  }
  it.bucket = sVar15;
  it.d = pDVar10;
  do {
    uVar16 = it.bucket;
    pDVar10 = it.d;
    local_c8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_c8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    uVar9 = uVar16 >> 7;
    uVar13 = (uint)it.bucket & 0x7f;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              (&local_c8,
               (QPersistentModelIndex *)
               (pDVar10->spans[uVar9].entries[pDVar10->spans[uVar9].offsets[uVar13]].storage.data +
               8));
    local_88.d = (QPersistentModelIndexData *)local_c8._0_8_;
    QVar5.d = local_88.d;
    pQStack_80 = (QObject *)local_c8.i;
    local_78 = local_c8.m.ptr;
    local_88.d._4_4_ = local_c8.c;
    local_88.d._0_4_ = local_c8.r;
    uVar8 = local_88.d._4_4_ | (uint)local_88.d;
    local_88.d = QVar5.d;
    if (local_c8.m.ptr != (QAbstractItemModel *)0x0 && -1 < (int)uVar8) {
      while( true ) {
        local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        (**(code **)(*(long *)local_78 + 0x68))(&local_58,local_78,&local_88);
        if ((((local_58.r == parent->r) && (local_58.c == parent->c)) &&
            ((QObject *)local_58.i == (QObject *)parent->i)) && (local_58.m.ptr == (parent->m).ptr))
        break;
        local_78 = local_58.m.ptr;
        local_88.d = (QPersistentModelIndexData *)local_58._0_8_;
        pQStack_80 = (QObject *)local_58.i;
        if (((local_58.r < 0) || ((long)local_58._0_8_ < 0)) ||
           (local_58.m.ptr == (QAbstractItemModel *)0x0)) goto LAB_0053a307;
      }
      if ((((int)(uint)local_88.d <= end) && (start <= (int)(uint)local_88.d)) &&
         ((-1 < (int)(uint)local_88.d &&
          ((-1 < (long)local_88.d && (local_78 != (QAbstractItemModel *)0x0)))))) {
        this_00 = *(QWidget **)
                   pDVar10->spans[uVar9].entries[pDVar10->spans[uVar9].offsets[uVar13]].storage.data
        ;
        local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::QPersistentModelIndex(&local_88,&local_c8);
        QHash<QPersistentModelIndex,_QEditorInfo>::takeImpl<QPersistentModelIndex>
                  ((QEditorInfo *)&local_58,
                   (QHash<QPersistentModelIndex,_QEditorInfo> *)(lVar2 + 0x348),&local_88);
        QPersistentModelIndex::~QPersistentModelIndex(&local_88);
        it = (piter)QHash<QWidget_*,_QPersistentModelIndex>::erase
                              ((QHash<QWidget_*,_QPersistentModelIndex> *)(lVar2 + 0x340),
                               (const_iterator)it);
        if ((QPersistentModelIndexData *)local_58._0_8_ != (QPersistentModelIndexData *)0x0) {
          if (((*(int *)(local_58._0_8_ + 4) != 0) && ((QObject *)local_58.i != (QObject *)0x0)) &&
             (this_00 != (QWidget *)0x0)) {
            pQVar3 = *(QObject **)(lVar2 + 8);
            local_88.d = (QPersistentModelIndexData *)QObject::destroyed;
            pQStack_80 = (QObject *)0x0;
            local_68 = (void *)0x2a1;
            local_60 = 0;
            QObject::disconnectImpl
                      (&this_00->super_QObject,&local_88.d,pQVar3,&local_68,
                       (QMetaObject *)&QObject::staticMetaObject);
            QObject::removeEventFilter(&this_00->super_QObject);
            QWidget::hide(this_00);
            plVar11 = (long *)(**(code **)(*(long *)pQVar3 + 0x208))(pQVar3,&local_c8);
            if (plVar11 == (long *)0x0) {
              QObject::deleteLater();
            }
            else {
              (**(code **)(*plVar11 + 0x78))(plVar11,this_00,&local_c8);
            }
          }
          if ((QPersistentModelIndexData *)local_58._0_8_ != (QPersistentModelIndexData *)0x0) {
            LOCK();
            *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_58._0_8_ == 0) {
              pQVar14 = (QPersistentModelIndexData *)local_58._0_8_;
              if ((QPersistentModelIndexData *)local_58._0_8_ == (QPersistentModelIndexData *)0x0) {
                pQVar14 = (QPersistentModelIndexData *)0x0;
              }
              operator_delete(pQVar14);
            }
          }
        }
        goto LAB_0053a344;
      }
    }
LAB_0053a307:
    do {
      if (pDVar10->numBuckets - 1 == uVar16) {
        it = (piter)ZEXT816(0);
        break;
      }
      uVar16 = uVar16 + 1;
      it.bucket = uVar16;
      it.d = pDVar10;
    } while (pDVar10->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f] == 0xff);
LAB_0053a344:
  } while ((it.d != (Data<QHashPrivate::Node<QWidget_*,_QPersistentModelIndex>_> *)0x0) ||
          (it.bucket != 0));
LAB_0053a51e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::rowsAboutToBeRemoved(const QModelIndex &parent, int start, int end)
{
    Q_D(QAbstractItemView);

    setState(CollapsingState);

    // Ensure one selected item in single selection mode.
    QModelIndex current = currentIndex();
    if (d->selectionMode == SingleSelection
        && current.isValid()
        && current.row() >= start
        && current.row() <= end
        && current.parent() == parent) {
        int totalToRemove = end - start + 1;
        if (d->model->rowCount(parent) <= totalToRemove) { // no more children
            QModelIndex index = parent;
            while (index != d->root && !d->isIndexEnabled(index))
                index = index.parent();
            if (index != d->root)
                setCurrentIndex(index);
        } else {
            int row = end + 1;
            QModelIndex next;
            const int rowCount = d->model->rowCount(parent);
            bool found = false;
            // find the next visible and enabled item
            while (row < rowCount && !found) {
                next = d->model->index(row++, current.column(), current.parent());
#ifdef QT_DEBUG
                if (!next.isValid()) {
                    qWarning("Model unexpectedly returned an invalid index");
                    break;
                }
#endif
                if (!isIndexHidden(next) && d->isIndexEnabled(next)) {
                    found = true;
                    break;
                }
            }

            if (!found) {
                row = start - 1;
                // find the previous visible and enabled item
                while (row >= 0) {
                    next = d->model->index(row--, current.column(), current.parent());
#ifdef QT_DEBUG
                    if (!next.isValid()) {
                        qWarning("Model unexpectedly returned an invalid index");
                        break;
                    }
#endif
                    if (!isIndexHidden(next) && d->isIndexEnabled(next))
                        break;
                }
            }

            setCurrentIndex(next);
        }
    }

    // Remove all affected editors; this is more efficient than waiting for updateGeometries() to clean out editors for invalid indexes
    const auto findDirectChildOf = [](const QModelIndex &parent, QModelIndex child)
    {
        while (child.isValid()) {
            const auto parentIndex = child.parent();
            if (parentIndex == parent)
                return child;
            child = parentIndex;
        }
        return QModelIndex();
    };
    QEditorIndexHash::iterator i = d->editorIndexHash.begin();
    while (i != d->editorIndexHash.end()) {
        const QModelIndex index = i.value();
        const QModelIndex directChild = findDirectChildOf(parent, index);
        if (directChild.isValid() && directChild.row() >= start && directChild.row() <= end) {
            QWidget *editor = i.key();
            QEditorInfo info = d->indexEditorHash.take(index);
            i = d->editorIndexHash.erase(i);
            if (info.widget)
                d->releaseEditor(editor, index);
        } else {
            ++i;
        }
    }
}